

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

TValue * lj_tab_set(lua_State *L,GCtab *t,cTValue *key)

{
  GCtab *t_00;
  uint key_00;
  int iVar1;
  TValue *pTVar2;
  cTValue *in_RDX;
  lua_State *in_RSI;
  int32_t k;
  lua_Number nk;
  Node *n;
  ErrMsg in_stack_ffffffffffffffbc;
  lua_State *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  GCtab *in_stack_ffffffffffffffd0;
  lua_State *in_stack_ffffffffffffffd8;
  TValue *local_8;
  
  in_RSI->dummy_ffid = '\0';
  if ((in_RDX->field_2).it == 0xfffffffb) {
    local_8 = lj_tab_setstr(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                            (GCstr *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    if ((in_RDX->field_2).it < 0xfffeffff) {
      t_00 = (GCtab *)in_RDX->n;
      key_00 = (uint)(double)t_00;
      if (((double)t_00 == (double)(int)key_00) && (!NAN((double)t_00) && !NAN((double)(int)key_00))
         ) {
        if (key_00 < *(uint *)&in_RSI->top) {
          return (TValue *)((ulong)(in_RSI->glref).ptr32 + (long)(int)key_00 * 8);
        }
        pTVar2 = lj_tab_setinth(in_stack_ffffffffffffffd8,t_00,key_00);
        return pTVar2;
      }
      if ((in_RDX->n != in_RDX->n) || (NAN(in_RDX->n) || NAN(in_RDX->n))) {
        lj_err_msg(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
    }
    else if ((in_RDX->field_2).it == 0xffffffff) {
      lj_err_msg(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    pTVar2 = &hashkey((GCtab *)in_RSI,in_RDX)->val;
    do {
      iVar1 = lj_obj_equal(pTVar2 + 1,in_RDX);
      if (iVar1 != 0) {
        return pTVar2;
      }
      pTVar2 = (TValue *)(ulong)pTVar2[2].u32.lo;
    } while (pTVar2 != (TValue *)0x0);
    local_8 = lj_tab_newkey(in_RSI,(GCtab *)&in_RDX->field_2,(cTValue *)0x0);
  }
  return local_8;
}

Assistant:

TValue *lj_tab_set(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n;
  t->nomm = 0;  /* Invalidate negative metamethod cache. */
  if (tvisstr(key)) {
    return lj_tab_setstr(L, t, strV(key));
  } else if (tvisint(key)) {
    return lj_tab_setint(L, t, intV(key));
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k)
      return lj_tab_setint(L, t, k);
    if (tvisnan(key))
      lj_err_msg(L, LJ_ERR_NANIDX);
    /* Else use the generic lookup. */
  } else if (tvisnil(key)) {
    lj_err_msg(L, LJ_ERR_NILIDX);
  }
  n = hashkey(t, key);
  do {
    if (lj_obj_equal(&n->key, key))
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, key);
}